

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_loop.cpp
# Opt level: O1

void __thiscall EventLoop::execute_task_funcs(EventLoop *this)

{
  pointer pfVar1;
  pointer pfVar2;
  pointer pfVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> functors;
  vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_> local_38;
  
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->el_dealing_task_funcs = true;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->el_mutex);
  if (iVar4 != 0) {
LAB_0010a514:
    std::__throw_system_error(iVar4);
  }
  pfVar1 = (this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pfVar2 = (this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pfVar3 = (this->el_task_funcs).
           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->el_task_funcs).
  super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_start = pfVar1;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = pfVar2;
  local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = pfVar3;
  pthread_mutex_unlock((pthread_mutex_t *)&this->el_mutex);
  if (local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_38.super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    lVar5 = 0;
    uVar6 = 0;
    do {
      if (*(long *)((long)&((local_38.
                             super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                           _M_manager + lVar5) == 0) {
        iVar4 = std::__throw_bad_function_call();
        goto LAB_0010a514;
      }
      (**(code **)((long)&(local_38.
                           super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_invoker + lVar5))
                ((long)&((local_38.
                          super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super__Function_base).
                        _M_functor + lVar5);
      uVar6 = uVar6 + 1;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 < (ulong)((long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_38.
                                   super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this->el_dealing_task_funcs = false;
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~vector(&local_38);
  return;
}

Assistant:

void EventLoop::execute_task_funcs() {
    std::vector<Task> functors;
    el_dealing_task_funcs = true;

    {
        lock_guard<mutex> lock(el_mutex);
        functors.swap(el_task_funcs);
    }

    for (size_t i = 0; i < functors.size(); ++i) functors[i]();
    el_dealing_task_funcs = false;
}